

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVector.h
# Opt level: O1

void __thiscall
JointPolicyPureVector::JointPolicyPureVector(JointPolicyPureVector *this,JointPolicyPureVector *a)

{
  JointPolicyDiscretePure::JointPolicyDiscretePure
            ((JointPolicyDiscretePure *)this,(JointPolicyDiscretePure *)a);
  JPolComponent_VectorImplementation::JPolComponent_VectorImplementation
            ((JPolComponent_VectorImplementation *)(this + 0x38),
             (JPolComponent_VectorImplementation *)(a + 0x38));
  *(code **)this = std::__cxx11::string::operator=;
  *(code **)(this + 0x38) = __cxa_rethrow;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  return;
}

Assistant:

JointPolicyPureVector(const JointPolicyPureVector& a)
            :
            JointPolicyDiscretePure(a)
            , JPolComponent_VectorImplementation(a)
        {}